

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2SOImm(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint imm_1;
  uint rot;
  uint unrot;
  uint imm;
  uint byte;
  uint ctrl;
  void *Decoder_local;
  uint64_t Address_local;
  uint Val_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction_4(Val,10,2);
  if (uVar1 == 0) {
    uVar1 = fieldFromInstruction_4(Val,8,2);
    uVar2 = fieldFromInstruction_4(Val,0,8);
    switch(uVar1) {
    case 0:
      MCOperand_CreateImm0(Inst,(ulong)uVar2);
      break;
    case 1:
      MCOperand_CreateImm0(Inst,(ulong)(uVar2 << 0x10 | uVar2));
      break;
    case 2:
      MCOperand_CreateImm0(Inst,(ulong)(uVar2 << 0x18 | uVar2 << 8));
      break;
    case 3:
      MCOperand_CreateImm0(Inst,(ulong)(uVar2 << 0x18 | uVar2 << 0x10 | uVar2 << 8 | uVar2));
    }
  }
  else {
    uVar1 = fieldFromInstruction_4(Val,0,7);
    uVar2 = fieldFromInstruction_4(Val,7,5);
    MCOperand_CreateImm0
              (Inst,(ulong)((uVar1 | 0x80) >> ((byte)uVar2 & 0x1f) |
                           (uVar1 | 0x80) << (0x20 - (byte)uVar2 & 0x1f)));
  }
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeT2SOImm(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	unsigned ctrl = fieldFromInstruction_4(Val, 10, 2);
	if (ctrl == 0) {
		unsigned byte = fieldFromInstruction_4(Val, 8, 2);
		unsigned imm = fieldFromInstruction_4(Val, 0, 8);
		switch (byte) {
			case 0:
				MCOperand_CreateImm0(Inst, imm);
				break;
			case 1:
				MCOperand_CreateImm0(Inst, (imm << 16) | imm);
				break;
			case 2:
				MCOperand_CreateImm0(Inst, (imm << 24) | (imm << 8));
				break;
			case 3:
				MCOperand_CreateImm0(Inst, (imm << 24) | (imm << 16) | (imm << 8)  |  imm);
				break;
		}
	} else {
		unsigned unrot = fieldFromInstruction_4(Val, 0, 7) | 0x80;
		unsigned rot = fieldFromInstruction_4(Val, 7, 5);
		unsigned imm = (unrot >> rot) | (unrot << ((32-rot)&31));
		MCOperand_CreateImm0(Inst, imm);
	}

	return MCDisassembler_Success;
}